

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMemoryAllocation.h
# Opt level: O1

bool okReserve<int>(vector<int,_std::allocator<int>_> *use_vector,HighsInt dimension)

{
  std::vector<int,_std::allocator<int>_>::reserve(use_vector,(long)dimension);
  return true;
}

Assistant:

bool okReserve(std::vector<T>& use_vector, HighsInt dimension) {
  try {
    use_vector.reserve(dimension);
  } catch (const std::bad_alloc& e) {
    printf("HighsMemoryAllocation::okReserve fails with %s\n", e.what());
    return false;
  }
  return true;
}